

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# definitions.h
# Opt level: O1

void __thiscall Init::WorkspaceFolders::reflect(WorkspaceFolders *this,StringWriter *writer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_38;
  
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartObject(writer);
  paVar1 = &local_38.field_2;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"supported","");
  reflectBool(writer,&local_38,this->supported,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"changeNotifications","");
  reflectString(writer,&local_38,&this->changeNotifications,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndObject(writer,0);
  return;
}

Assistant:

void reflect (StringWriter &writer) override {
            writer.StartObject();
            reflectBool(writer, "supported", supported);
            reflectString(writer, "changeNotifications", changeNotifications);
            writer.EndObject();
        }